

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

void add_format(FMFormat_conflict f,FMFormat_conflict *sorted,FMFormat_conflict *visited,
               FMFormat_conflict *stack)

{
  FMFormat_conflict p_Var1;
  FMFormat_conflict *pp_Var2;
  FMFormat_conflict *__base;
  ulong uVar3;
  ulong uVar4;
  code *stack_00;
  uint uVar5;
  size_t __nmemb;
  FMFormat_conflict tmp [100];
  
  __base = tmp;
  pp_Var2 = visited;
  do {
    p_Var1 = *pp_Var2;
    if (p_Var1 == (FMFormat_conflict)0x0) {
      if (99 < (ulong)(long)f->field_count) {
        __base = (FMFormat_conflict *)ffs_malloc((long)f->field_count << 3);
      }
      add_to_list(f,visited);
      uVar4 = 0;
      uVar3 = (ulong)(uint)f->field_count;
      if (f->field_count < 1) {
        uVar3 = uVar4;
      }
      uVar5 = 0;
      for (; __nmemb = (size_t)(int)uVar5, uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (f->field_subformats[uVar4] != (FMFormat_conflict)0x0) {
          uVar5 = uVar5 + 1;
          *(FMFormat_conflict *)((long)__base + __nmemb * 8) = f->field_subformats[uVar4];
        }
      }
      stack_00 = compare_by_name_FMFormat;
      qsort(__base,__nmemb,8,compare_by_name_FMFormat);
      uVar4 = 0;
      uVar3 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        add_format(*(FMFormat_conflict *)((long)__base + uVar4 * 8),sorted,visited,
                   (FMFormat_conflict *)stack_00);
      }
      add_to_list(f,sorted);
      if (__base != tmp) {
        free(__base);
      }
      return;
    }
    pp_Var2 = pp_Var2 + 1;
  } while (p_Var1 != f);
  return;
}

Assistant:

static
void add_format(FMFormat f, FMFormat* sorted, FMFormat *visited, FMFormat* stack)
{
    /* if n has not been visited yet then */
    if (!on_list(f, visited)) {
	FMFormat tmp[100];
	FMFormat *tmp_list = &tmp[0];
	if (f->field_count >= (sizeof(tmp)/sizeof(tmp[0]))) {
	    tmp_list = malloc(f->field_count * sizeof(tmp[0]));
	}
	int count = 0;
	int i;
        /* mark n as visited */
	add_to_list(f, visited);

	/* get subfields and sort them by name for predictability */
	for (i=0; i < f->field_count; i++) {
	    if (f->field_subformats[i] != NULL) {
		tmp_list[count++] = f->field_subformats[i];
	    }
	}
	qsort(&tmp_list[0], count, sizeof(tmp_list[0]), compare_by_name_FMFormat);

	for (i=0; i < count; i++) {
	    add_format(tmp_list[i], sorted, visited, stack);
	}
	add_to_list(f, sorted);
	if (tmp_list != &tmp[0]) free(tmp_list);
    }
}